

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::
ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
CallOut(ChValueSpecific<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,ChArchiveOut *marchive)

{
  (*(marchive->super_ChArchive)._vptr_ChArchive[8])(marchive);
  return;
}

Assistant:

void ChValueSpecific<TClass>::CallOut(ChArchiveOut& marchive) {
          marchive.out(CHNVP(*this->_ptr_to_val,this->_name.c_str()));
}